

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O1

Value * __thiscall Kvm::makeEnvironment(Kvm *this)

{
  pointer *ppppVVar1;
  Value *env;
  Value *local_18;
  
  local_18 = (Value *)0x0;
  Kgc::pushLocalStackRoot(&this->gc_,&local_18);
  local_18 = extendEnvironment(this,this->NIL,this->NIL,this->EMPTY_ENV);
  populateEnvironment(this,local_18);
  ppppVVar1 = &(this->gc_).localStackRoots_.
               super__Vector_base<const_Value_**,_std::allocator<const_Value_**>_>._M_impl.
               super__Vector_impl_data._M_finish;
  *ppppVVar1 = *ppppVVar1 + -1;
  return local_18;
}

Assistant:

const Value* Kvm::makeEnvironment()
{
    const Value *env = nullptr;
    gc_.pushLocalStackRoot(&env);
    
    env = setupEnvironment();
    populateEnvironment(const_cast<Value *>(env));
    
    gc_.popLocalStackRoot();
    return env;
}